

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StatsdServer.hpp
# Opt level: O2

void __thiscall Statsd::StatsdServer::~StatsdServer(StatsdServer *this)

{
  if (this->m_socket != -1) {
    close(this->m_socket);
  }
  std::__cxx11::string::~string((string *)&this->m_errorMessage);
  return;
}

Assistant:

~StatsdServer() {
        if (detail::isValidSocket(m_socket)) {
            SOCKET_CLOSE(m_socket);
        }
    }